

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_float,_float,_vkt::shaderexecutor::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_float,_float,_vkt::shaderexecutor::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  pointer pSVar1;
  long *plVar2;
  Expr<float> *pEVar3;
  Interval *pIVar4;
  double dVar5;
  undefined7 uVar6;
  IVal *pIVar7;
  size_t ndx;
  ulong uVar8;
  long lVar9;
  Environment funEnv;
  EvalContext funCtx;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_c0;
  undefined8 local_90;
  double dStack_88;
  double local_80;
  int local_78;
  int iStack_74;
  int iStack_70;
  YesNoMaybe YStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  double local_58;
  Precision local_50;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_48;
  int local_40;
  
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  initialize(this);
  Environment::bind<float>
            ((Environment *)&local_c0,
             (this->m_var0).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr,
             args->a);
  Environment::bind<float>
            ((Environment *)&local_c0,
             (this->m_var1).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr,
             args->b);
  Environment::bind<float>
            ((Environment *)&local_c0,
             (this->m_var2).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr,
             args->c);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_c0,
             (this->m_var3).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             args->d);
  local_50 = ctx->floatPrecision;
  local_40 = ctx->callDepth;
  local_58 = (ctx->format).m_maxValue;
  local_78 = (ctx->format).m_minExp;
  iStack_74 = (ctx->format).m_maxExp;
  iStack_70 = (ctx->format).m_fractionBits;
  YStack_6c = (ctx->format).m_hasSubnormal;
  local_68._0_4_ = (ctx->format).m_hasInf;
  local_68._4_4_ = (ctx->format).m_hasNaN;
  uStack_60 = *(undefined8 *)&(ctx->format).m_exactPrecision;
  lVar9 = 0;
  uVar8 = 0;
  local_48 = &local_c0;
  while( true ) {
    pSVar1 = (this->m_body).
             super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_body).
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 4) <= uVar8)
    break;
    plVar2 = *(long **)((long)&(pSVar1->super_SharedPtr<const_vkt::shaderexecutor::Statement>).m_ptr
                       + lVar9);
    (**(code **)(*plVar2 + 0x18))(plVar2,&local_78);
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + 0x10;
  }
  pEVar3 = (this->m_ret).super_ExprPBase<float>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(&local_90,pEVar3,&local_78);
  __return_storage_ptr__->m_hi = local_80;
  *(undefined8 *)__return_storage_ptr__ = local_90;
  __return_storage_ptr__->m_lo = dStack_88;
  pIVar7 = Environment::lookup<float>
                     ((Environment *)&local_c0,
                      (this->m_var0).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
                      m_ptr);
  pIVar4 = args->a;
  pIVar4->m_hi = pIVar7->m_hi;
  uVar6 = *(undefined7 *)&pIVar7->field_0x1;
  dVar5 = pIVar7->m_lo;
  pIVar4->m_hasNaN = pIVar7->m_hasNaN;
  *(undefined7 *)&pIVar4->field_0x1 = uVar6;
  pIVar4->m_lo = dVar5;
  pIVar7 = Environment::lookup<float>
                     ((Environment *)&local_c0,
                      (this->m_var1).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
                      m_ptr);
  pIVar4 = args->b;
  pIVar4->m_hi = pIVar7->m_hi;
  uVar6 = *(undefined7 *)&pIVar7->field_0x1;
  dVar5 = pIVar7->m_lo;
  pIVar4->m_hasNaN = pIVar7->m_hasNaN;
  *(undefined7 *)&pIVar4->field_0x1 = uVar6;
  pIVar4->m_lo = dVar5;
  pIVar7 = Environment::lookup<float>
                     ((Environment *)&local_c0,
                      (this->m_var2).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
                      m_ptr);
  pIVar4 = args->c;
  pIVar4->m_hi = pIVar7->m_hi;
  uVar6 = *(undefined7 *)&pIVar7->field_0x1;
  dVar5 = pIVar7->m_lo;
  pIVar4->m_hasNaN = pIVar7->m_hasNaN;
  *(undefined7 *)&pIVar4->field_0x1 = uVar6;
  pIVar4->m_lo = dVar5;
  Environment::lookup<vkt::shaderexecutor::Void>
            ((Environment *)&local_c0,
             (this->m_var3).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}